

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::render
               (TestContext *testContext,RenderContext *renderContext,
               TextureRenderer *textureRenderer,ResultCollector *results,Random *rng,deUint32 name,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *data,ImageInfo *info,Verify verify)

{
  deUint32 dVar1;
  deUint32 name_local;
  Random *rng_local;
  ResultCollector *results_local;
  TextureRenderer *textureRenderer_local;
  RenderContext *renderContext_local;
  TestContext *testContext_local;
  
  dVar1 = ImageInfo::getTarget(info);
  if (dVar1 == 0xde1) {
    renderTexture2D(testContext,renderContext,textureRenderer,results,rng,name,data,info,verify);
  }
  else if (dVar1 == 0x806f) {
    renderTexture3D(testContext,renderContext,textureRenderer,results,rng,name,data,info,verify);
  }
  else if (dVar1 == 0x8513) {
    renderTextureCubemap
              (testContext,renderContext,textureRenderer,results,rng,name,data,info,verify);
  }
  else if (dVar1 == 0x8c1a) {
    renderTexture2DArray
              (testContext,renderContext,textureRenderer,results,rng,name,data,info,verify);
  }
  else if (dVar1 == 0x8d41) {
    renderRenderbuffer(testContext,renderContext,results,name,data,info,verify);
  }
  return;
}

Assistant:

void render (tcu::TestContext&						testContext,
			 glu::RenderContext&					renderContext,
			 TextureRenderer&						textureRenderer,
			 tcu::ResultCollector&					results,
			 de::Random&							rng,
			 deUint32								name,
			 const vector<ArrayBuffer<deUint8> >&	data,
			 const ImageInfo&						info,
			 Verify									verify)
{
	switch (info.getTarget())
	{
		case GL_TEXTURE_2D:
			renderTexture2D(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_3D:
			renderTexture3D(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_CUBE_MAP:
			renderTextureCubemap(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_2D_ARRAY:
			renderTexture2DArray(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_RENDERBUFFER:
			renderRenderbuffer(testContext, renderContext, results, name, data, info, verify);
			break;

		default:
			DE_ASSERT(false);
	}
}